

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::getVLV(Binasc *this,istream *infile,int *trackbytes)

{
  ulong in_RAX;
  uint uVar1;
  uchar ch;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::istream::read((char *)infile,(long)&uStack_28 + 7);
  *trackbytes = *trackbytes + 1;
  uVar1 = uStack_28._7_1_ & 0x7f;
  if ((long)uStack_28 < 0) {
    do {
      std::istream::read((char *)infile,(long)&uStack_28 + 7);
      *trackbytes = *trackbytes + 1;
      uVar1 = uVar1 << 7 | uStack_28._7_1_ & 0x7f;
    } while ((long)uStack_28 < 0);
  }
  return uVar1;
}

Assistant:

int Binasc::getVLV(std::istream& infile, int& trackbytes) {
	int output = 0;
	uchar ch = 0;
	infile.read((char*)&ch, 1);
	trackbytes++;
	output = (output << 7) | (0x7f & ch);
	while (ch >= 0x80) {
		infile.read((char*)&ch, 1);
		trackbytes++;
		output = (output << 7) | (0x7f & ch);
	}
	return output;
}